

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_descriptor_addr(miniscript_node_t *node,miniscript_node_t *parent)

{
  int32_t iVar1;
  int iVar2;
  
  iVar2 = -2;
  if (parent == (miniscript_node_t *)0x0) {
    iVar1 = get_child_list_count(node);
    if ((iVar1 == node->info->inner_num) && (node->child->info == (miniscript_item_t *)0x0)) {
      iVar2 = (uint)(((byte)node->child->kind & 0x10) >> 4) * 2 + -2;
    }
  }
  return iVar2;
}

Assistant:

static int verify_descriptor_addr(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent || (get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        ((node->child->kind & DESCRIPTOR_KIND_ADDRESS) != DESCRIPTOR_KIND_ADDRESS))
        return WALLY_EINVAL;

    return WALLY_OK;
}